

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledImage.cpp
# Opt level: O2

SharedPtr<Decorator> __thiscall
Rml::DecoratorTiledImageInstancer::InstanceDecorator
          (DecoratorTiledImageInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *instancer_interface)

{
  Texture _texture;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  DecoratorInstancerInterface *in_R8;
  SharedPtr<Decorator> SVar3;
  SharedPtr<Rml::DecoratorTiledImage> decorator;
  Texture texture;
  Tile tile;
  
  DecoratorTiled::Tile::Tile(&tile);
  texture.render_manager = (RenderManager *)0x0;
  texture.file_index = Invalid;
  texture.callback_index = Invalid;
  bVar1 = DecoratorTiledInstancer::GetTileProperties
                    ((DecoratorTiledInstancer *)param_1,&tile,&texture,1,
                     (PropertyDictionary *)instancer_interface,in_R8);
  if (bVar1) {
    ::std::make_shared<Rml::DecoratorTiledImage>();
    _texture.file_index = texture.file_index;
    _texture.callback_index = texture.callback_index;
    _texture.render_manager = texture.render_manager;
    bVar1 = DecoratorTiledImage::Initialise
                      (decorator.
                       super___shared_ptr<Rml::DecoratorTiledImage,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,&tile,_texture);
    _Var2 = decorator.super___shared_ptr<Rml::DecoratorTiledImage,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    if (bVar1) {
      decorator.super___shared_ptr<Rml::DecoratorTiledImage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
           (_func_int **)
           decorator.super___shared_ptr<Rml::DecoratorTiledImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
      properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var2._M_pi;
      decorator.super___shared_ptr<Rml::DecoratorTiledImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
           (_func_int **)0x0;
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
      properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&decorator.super___shared_ptr<Rml::DecoratorTiledImage,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
         (_func_int **)0x0;
    (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
    properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorTiledImageInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& instancer_interface)
{
	DecoratorTiled::Tile tile;
	Texture texture;

	if (!GetTileProperties(&tile, &texture, 1, properties, instancer_interface))
		return nullptr;

	auto decorator = MakeShared<DecoratorTiledImage>();

	if (!decorator->Initialise(tile, texture))
		return nullptr;

	return decorator;
}